

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_run_completed(uv_udp_t *handle)

{
  uint *puVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  
  if ((handle->flags >> 0x18 & 1) != 0) {
    __assert_fail("!(handle->flags & UV_HANDLE_UDP_PROCESSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x5f,"void uv__udp_run_completed(uv_udp_t *)");
  }
  handle->flags = handle->flags | 0x1000000;
  plVar2 = (long *)handle->write_completed_queue[0];
  while( true ) {
    if (handle->write_completed_queue == (void **)plVar2) {
      if (handle->write_queue == (void **)handle->write_queue[0]) {
        uv__io_stop(handle->loop,&handle->io_watcher,4);
        iVar5 = uv__io_active(&handle->io_watcher,1);
        uVar7 = handle->flags;
        if (((uVar7 & 4) != 0 && iVar5 == 0) &&
           (uVar6 = uVar7 & 0xfffffffb, uVar4 = uVar7 & 8, uVar7 = uVar6, uVar4 != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 - 1;
        }
      }
      else {
        uVar7 = handle->flags;
      }
      handle->flags = uVar7 & 0xfeffffff;
      return;
    }
    lVar3 = *plVar2;
    *(long *)plVar2[1] = lVar3;
    *(long *)(lVar3 + 8) = plVar2[1];
    uVar7 = (handle->loop->active_reqs).count;
    if (uVar7 == 0) break;
    (handle->loop->active_reqs).count = uVar7 - 1;
    sVar8 = uv__count_bufs((uv_buf_t *)plVar2[0x13],*(uint *)(plVar2 + 0x12));
    handle->send_queue_size = handle->send_queue_size - sVar8;
    handle->send_queue_count = handle->send_queue_count - 1;
    if ((long *)plVar2[0x13] != plVar2 + 0x16) {
      uv__free((long *)plVar2[0x13]);
    }
    plVar2[0x13] = 0;
    if ((code *)plVar2[0x15] != (code *)0x0) {
      uVar9 = plVar2[0x14] & 0xffffffff;
      if (-1 < plVar2[0x14]) {
        uVar9 = 0;
      }
      (*(code *)plVar2[0x15])(plVar2 + -10,uVar9);
    }
    plVar2 = (long *)handle->write_completed_queue[0];
  }
  __assert_fail("uv__has_active_reqs(handle->loop)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                ,0x67,"void uv__udp_run_completed(uv_udp_t *)");
}

Assistant:

static void uv__udp_run_completed(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;

  assert(!(handle->flags & UV_HANDLE_UDP_PROCESSING));
  handle->flags |= UV_HANDLE_UDP_PROCESSING;

  while (!QUEUE_EMPTY(&handle->write_completed_queue)) {
    q = QUEUE_HEAD(&handle->write_completed_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    uv__req_unregister(handle->loop, req);

    handle->send_queue_size -= uv__count_bufs(req->bufs, req->nbufs);
    handle->send_queue_count--;

    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;

    if (req->send_cb == NULL)
      continue;

    /* req->status >= 0 == bytes written
     * req->status <  0 == errno
     */
    if (req->status >= 0)
      req->send_cb(req, 0);
    else
      req->send_cb(req, req->status);
  }

  if (QUEUE_EMPTY(&handle->write_queue)) {
    /* Pending queue and completion queue empty, stop watcher. */
    uv__io_stop(handle->loop, &handle->io_watcher, POLLOUT);
    if (!uv__io_active(&handle->io_watcher, POLLIN))
      uv__handle_stop(handle);
  }

  handle->flags &= ~UV_HANDLE_UDP_PROCESSING;
}